

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::MarbleTexture::Evaluate(MarbleTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  float fVar1;
  Float FVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  long lVar9;
  int iVar10;
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  float fVar16;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  float fVar17;
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 in_register_000013c4 [12];
  Point3f PVar23;
  SampledSpectrum SVar24;
  Vector3f dpdx;
  Vector3f dpdy;
  uint local_d8;
  undefined8 local_c8;
  float fStack_c0;
  undefined1 auStack_bc [8];
  float fStack_b4;
  undefined8 uStack_b0;
  float fStack_a8;
  undefined1 auStack_a4 [8];
  float afStack_9c [13];
  undefined8 local_68;
  undefined4 local_60;
  RGB local_50;
  Tuple3<pbrt::Vector3,_float> local_40;
  Tuple3<pbrt::Vector3,_float> local_30;
  RGBAlbedoSpectrum local_24;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_30.x = 0.0;
  local_30.y = 0.0;
  local_30.z = 0.0;
  local_40.x = 0.0;
  local_40.y = 0.0;
  local_40.z = 0.0;
  PVar23 = TransformMapping3D::Map
                     ((TransformMapping3D *)
                      ((this->mapping).super_TaggedPointer<pbrt::TransformMapping3D>.bits &
                      0xffffffffffff),ctx,(Vector3f *)&local_30,(Vector3f *)&local_40);
  fVar1 = this->scale;
  fVar12 = PVar23.super_Tuple3<pbrt::Point3,_float>.x * fVar1;
  fVar16 = PVar23.super_Tuple3<pbrt::Point3,_float>.y * fVar1;
  auVar11 = vmovshdup_avx(CONCAT412(ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x * fVar1,
                                    CONCAT48(ctx.p.super_Tuple3<pbrt::Point3,_float>.z * fVar1,
                                             CONCAT44(fVar16,fVar12))));
  FVar2 = this->variation;
  dpdx.super_Tuple3<pbrt::Vector3,_float>.x = fVar1 * local_30.x;
  dpdx.super_Tuple3<pbrt::Vector3,_float>.y = fVar1 * local_30.y;
  dpdy.super_Tuple3<pbrt::Vector3,_float>.x = fVar1 * local_40.x;
  dpdy.super_Tuple3<pbrt::Vector3,_float>.y = fVar1 * local_40.y;
  PVar23.super_Tuple3<pbrt::Point3,_float>.z = PVar23.super_Tuple3<pbrt::Point3,_float>.z * fVar1;
  PVar23.super_Tuple3<pbrt::Point3,_float>.x = fVar12;
  PVar23.super_Tuple3<pbrt::Point3,_float>.y = fVar16;
  dpdx.super_Tuple3<pbrt::Vector3,_float>.z = fVar1 * local_30.z;
  dpdy.super_Tuple3<pbrt::Vector3,_float>.z = fVar1 * local_40.z;
  auVar14._0_4_ = FBm(PVar23,dpdx,dpdy,this->omega,this->octaves);
  auVar14._4_60_ = extraout_var;
  local_d8 = auVar11._0_4_;
  auVar11 = vfmadd213ss_fma(auVar14._0_16_,ZEXT416((uint)FVar2),ZEXT416(local_d8));
  auVar15._0_4_ = sinf(auVar11._0_4_);
  auVar15._4_60_ = extraout_var_00;
  auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),auVar15._0_16_,
                           SUB6416(ZEXT464(0x3f000000),0));
  local_c8 = 0x3f147ae13f147ae1;
  _fStack_c0 = 0x3f147ae13f19999a;
  stack0xffffffffffffff48 = 0x3f19999a3f147ae1;
  uStack_b0 = 0x3f147ae13f147ae1;
  _fStack_a8 = 0x3f0000003f19999a;
  stack0xffffffffffffff60 = 0x3f0000003f000000;
  afStack_9c[1] = 0.6;
  afStack_9c[2] = 0.59;
  afStack_9c[3] = 0.58;
  afStack_9c[4] = 0.58;
  afStack_9c[5] = 0.58;
  afStack_9c[6] = 0.6;
  afStack_9c[7] = 0.58;
  afStack_9c[8] = 0.58;
  afStack_9c[9] = 0.6;
  afStack_9c[10] = 0.2;
  afStack_9c[0xb] = 0.2;
  afStack_9c[0xc] = 0.33;
  auVar11._8_4_ = 0x3f147ae1;
  auVar11._0_8_ = 0x3f147ae13f147ae1;
  auVar11._12_4_ = 0x3f147ae1;
  local_68 = vmovlps_avx(auVar11);
  local_60 = 0x3f19999a;
  auVar11 = ZEXT416((uint)(auVar8._0_4_ * 6.0));
  auVar11 = vroundss_avx(auVar11,auVar11,9);
  iVar10 = 5;
  if ((int)auVar11._0_4_ < 5) {
    iVar10 = (int)auVar11._0_4_;
  }
  auVar18._0_4_ = (float)iVar10;
  auVar18._4_12_ = in_register_000013c4;
  lVar9 = (long)iVar10;
  auVar11 = vfmsub231ss_fma(auVar18,SUB6416(ZEXT464(0x40c00000),0),auVar8);
  fVar17 = auVar11._0_4_;
  fVar7 = 1.0 - fVar17;
  fVar1 = fVar7 * (&fStack_b4)[lVar9 * 3] + fVar17 * (&fStack_a8)[lVar9 * 3];
  uVar3 = *(undefined8 *)((long)&local_c8 + lVar9 * 0xc);
  fVar12 = (float)*(undefined8 *)(auStack_bc + lVar9 * 0xc);
  fVar5 = (float)((ulong)*(undefined8 *)(auStack_bc + lVar9 * 0xc) >> 0x20);
  uVar4 = *(undefined8 *)((long)&uStack_b0 + lVar9 * 0xc);
  fVar16 = (float)uVar4;
  fVar6 = (float)((ulong)uVar4 >> 0x20);
  fVar19 = fVar7 * fVar12 + fVar17 * fVar16;
  fVar20 = fVar7 * fVar5 + fVar17 * fVar6;
  fVar21 = fVar7 * 0.0 + fVar17 * 0.0;
  fVar22 = fVar7 * 0.0 + fVar17 * 0.0;
  auVar13._0_4_ =
       fVar7 * (fVar7 * (fVar7 * (float)uVar3 + fVar17 * fVar12) + fVar17 * fVar19) +
       fVar17 * (fVar7 * fVar19 +
                fVar17 * (fVar7 * fVar16 + fVar17 * (float)*(undefined8 *)(auStack_a4 + lVar9 * 0xc)
                         ));
  auVar13._4_4_ =
       fVar7 * (fVar7 * (fVar7 * (float)((ulong)uVar3 >> 0x20) + fVar17 * fVar5) + fVar17 * fVar20)
       + fVar17 * (fVar7 * fVar20 +
                  fVar17 * (fVar7 * fVar6 +
                           fVar17 * (float)((ulong)*(undefined8 *)(auStack_a4 + lVar9 * 0xc) >> 0x20
                                           )));
  auVar13._8_4_ =
       fVar7 * (fVar7 * (fVar7 * 0.0 + fVar17 * 0.0) + fVar17 * fVar21) +
       fVar17 * (fVar7 * fVar21 + fVar17 * (fVar7 * 0.0 + fVar17 * 0.0));
  auVar13._12_4_ =
       fVar7 * (fVar7 * (fVar7 * 0.0 + fVar17 * 0.0) + fVar17 * fVar22) +
       fVar17 * (fVar7 * fVar22 + fVar17 * (fVar7 * 0.0 + fVar17 * 0.0));
  auVar8._8_4_ = 0x3fc00000;
  auVar8._0_8_ = 0x3fc000003fc00000;
  auVar8._12_4_ = 0x3fc00000;
  auVar11 = vmulps_avx512vl(auVar13,auVar8);
  local_50.b = (fVar7 * (fVar7 * (fVar7 * (&fStack_c0)[lVar9 * 3] + fVar17 * (&fStack_b4)[lVar9 * 3]
                                 ) + fVar17 * fVar1) +
               fVar17 * (fVar7 * fVar1 +
                        fVar17 * (fVar7 * (&fStack_a8)[lVar9 * 3] + fVar17 * afStack_9c[lVar9 * 3]))
               ) * 1.5;
  local_50._0_8_ = vmovlps_avx(auVar11);
  RGBAlbedoSpectrum::RGBAlbedoSpectrum(&local_24,RGBColorSpace::sRGB,&local_50);
  SVar24 = RGBAlbedoSpectrum::Sample(&local_24,&lambda);
  return (array<float,_4>)(array<float,_4>)SVar24;
}

Assistant:

SampledSpectrum MarbleTexture::Evaluate(TextureEvalContext ctx,
                                        SampledWavelengths lambda) const {
    Vector3f dpdx, dpdy;
    Point3f p = mapping.Map(ctx, &dpdx, &dpdy);
    p *= scale;
    Float marble = p.y + variation * FBm(p, scale * dpdx, scale * dpdy, omega, octaves);
    Float t = .5f + .5f * std::sin(marble);
    // Evaluate marble spline at $t$ to compute color _rgb_
    const RGB c[] = {
        {.58f, .58f, .6f}, {.58f, .58f, .6f}, {.58f, .58f, .6f},
        {.5f, .5f, .5f},   {.6f, .59f, .58f}, {.58f, .58f, .6f},
        {.58f, .58f, .6f}, {.2f, .2f, .33f},  {.58f, .58f, .6f},
    };
    int nSeg = PBRT_ARRAYSIZE(c) - 3;
    int first = std::min<int>(std::floor(t * nSeg), nSeg - 1);
    t = t * nSeg - first;
    RGB rgb = 1.5f * EvaluateCubicBezier(pstd::span(c + first, 4), t);

#ifdef PBRT_IS_GPU_CODE
    return RGBAlbedoSpectrum(*RGBColorSpace_sRGB, rgb).Sample(lambda);
#else
    return RGBAlbedoSpectrum(*RGBColorSpace::sRGB, rgb).Sample(lambda);
#endif
}